

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutCut.c
# Opt level: O1

Cut_Cut_t * Cut_CutAlloc(Cut_Man_t *p)

{
  Cut_Cut_t *pCVar1;
  uint uVar2;
  int iVar3;
  
  pCVar1 = (Cut_Cut_t *)Extra_MmFixedEntryFetch(p->pMmCuts);
  *(undefined8 *)pCVar1 = 0;
  pCVar1->uCanon0 = 0;
  pCVar1->uCanon1 = 0;
  pCVar1->pNext = (Cut_Cut_t *)0x0;
  uVar2 = (p->pParams->nVarsMax & 0xfU) << 0x18;
  *(uint *)pCVar1 = uVar2;
  *(uint *)pCVar1 = (p->fSimul & 1U) << 0x16 | uVar2;
  iVar3 = p->nCutsAlloc + 1;
  p->nCutsAlloc = iVar3;
  p->nCutsCur = p->nCutsCur + 1;
  iVar3 = iVar3 - p->nCutsDealloc;
  if (p->nCutsPeak < iVar3) {
    p->nCutsPeak = iVar3;
  }
  return pCVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates the cut.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Cut_Cut_t * Cut_CutAlloc( Cut_Man_t * p )
{
    Cut_Cut_t * pCut;
    // cut allocation
    pCut = (Cut_Cut_t *)Extra_MmFixedEntryFetch( p->pMmCuts );
    memset( pCut, 0, sizeof(Cut_Cut_t) );
    pCut->nVarsMax   = p->pParams->nVarsMax;
    pCut->fSimul     = p->fSimul;
    // statistics
    p->nCutsAlloc++;
    p->nCutsCur++;
    if ( p->nCutsPeak < p->nCutsAlloc - p->nCutsDealloc )
        p->nCutsPeak = p->nCutsAlloc - p->nCutsDealloc;
    return pCut;
}